

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

attribute * __thiscall MinVR::element::get_attribute(element *this,char *the_name)

{
  int iVar1;
  char *__s1;
  element *peVar2;
  
  peVar2 = this;
  do {
    peVar2 = (element *)
             (peVar2->m_attribute_list).
             super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    (this->it)._M_node = (_List_node_base *)peVar2;
    if (peVar2 == this) {
      return (attribute *)0x0;
    }
    __s1 = attribute::get_name((attribute *)
                               (peVar2->m_attribute_list).
                               super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>
                               ._M_impl._M_node._M_size);
    iVar1 = strcmp(__s1,the_name);
    peVar2 = (element *)(this->it)._M_node;
  } while (iVar1 != 0);
  return (attribute *)
         (peVar2->m_attribute_list).
         super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl._M_node.
         _M_size;
}

Assistant:

attribute* element::get_attribute(const char* the_name)
{
    it = m_attribute_list.begin();
    while(it != m_attribute_list.end())
    {
        if(strcmp((*it)->get_name(), the_name) == 0)
        {
            return ((attribute*) *it);
            break;
        }
        it++;
    }
    return NULL;
}